

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::FilterObjectHelper<unsigned_long>
              (RecyclableObject *obj,unsigned_long length,unsigned_long start,
              JavascriptArray *newArr,RecyclableObject *newObj,unsigned_long newStart,
              RecyclableObject *callBackFn,Var thisArg,ScriptContext *scriptContext)

{
  ThreadContext *this;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint uVar4;
  undefined4 *puVar5;
  Var newValue;
  JavascriptMethod p_Var6;
  uint64 uVar7;
  uint64 uVar8;
  Var aValue;
  Var aItem;
  ulong uVar9;
  double value;
  undefined1 auVar10 [16];
  BigIndex idxDest;
  BigIndex index;
  undefined1 local_78 [8];
  JsReentLock jsReentLock;
  undefined1 local_48 [8];
  BigIndex i;
  
  local_78 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_78)->noJsReentrancy;
  ((ThreadContext *)local_78)->noJsReentrancy = true;
  jsReentLock._24_8_ = obj;
  JsReentLock::setObjectForMutation((JsReentLock *)local_78,obj);
  BigIndex::BigIndex((BigIndex *)local_48,newStart);
  if (start < length) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      BVar3 = JavascriptOperators::HasItem((RecyclableObject *)jsReentLock._24_8_,start);
      JsReentLock::MutateArrayObject((JsReentLock *)local_78);
      *(bool *)((long)local_78 + 0x108) = true;
      if (BVar3 != 0) {
        *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        newValue = JavascriptOperators::GetItem
                             ((RecyclableObject *)jsReentLock._24_8_,start,scriptContext);
        this = scriptContext->threadContext;
        i.bigIndex._7_1_ = this->reentrancySafeOrHandled;
        this->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
        if (scriptContext->threadContext->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var6 = RecyclableObject::GetEntryPoint(callBackFn);
        if (start < 0x80000000) {
          uVar9 = start + 0x1000000000000;
        }
        else {
          auVar10._8_4_ = (int)(start >> 0x20);
          auVar10._0_8_ = start;
          auVar10._12_4_ = 0x45300000;
          value = ((double)CONCAT44(0x43300000,(int)start) - 4503599627370496.0) +
                  (auVar10._8_8_ - 1.9342813113834067e+25);
          uVar7 = NumberUtilities::ToSpecial(value);
          bVar2 = NumberUtilities::IsNan(value);
          if (bVar2) {
            uVar8 = NumberUtilities::ToSpecial(value);
            if (uVar8 != 0xfff8000000000000) {
              uVar8 = NumberUtilities::ToSpecial(value);
              if (uVar8 != 0x7ff8000000000000) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar5 = 1;
                bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                            ,0xa2,
                                            "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                            ,"We should only produce a NaN with this value");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                *puVar5 = 0;
              }
            }
          }
          uVar9 = uVar7 ^ 0xfffc000000000000;
        }
        aItem = (Var)0x0;
        aValue = (*p_Var6)(callBackFn,(CallInfo)callBackFn,0x2000004,0,0,0,0,0x2000004,thisArg,
                           newValue,uVar9,jsReentLock._24_8_);
        this->reentrancySafeOrHandled = (bool)i.bigIndex._7_1_;
        JsReentLock::MutateArrayObject((JsReentLock *)local_78);
        *(bool *)((long)local_78 + 0x108) = true;
        BVar3 = JavascriptConversion::ToBoolean(aValue,scriptContext);
        if (BVar3 != 0) {
          if (newArr == (JavascriptArray *)0x0) {
            *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            idxDest.bigIndex = (uint64)newValue;
            idxDest.index = i.index;
            idxDest._4_4_ = i._4_4_;
            uVar4 = SetArrayLikeObjects((JavascriptArray *)newObj,
                                        (RecyclableObject *)(ulong)(uint)local_48._0_4_,idxDest,
                                        aItem);
            index.bigIndex = (uint64)aItem;
            index.index = i.index;
            index._4_4_ = i._4_4_;
            ThrowErrorOnFailure((JavascriptArray *)(ulong)uVar4,(BOOL)scriptContext,
                                (ScriptContext *)(ulong)(uint)local_48._0_4_,index);
            JsReentLock::MutateArrayObject((JsReentLock *)local_78);
            *(bool *)((long)local_78 + 0x108) = true;
          }
          else {
            BigIndex::SetItem((BigIndex *)local_48,newArr,newValue);
          }
          if (local_48._0_4_ == 0xffffffff) {
            i._0_8_ = i._0_8_ + 1;
          }
          else {
            local_48._0_4_ = local_48._0_4_ + 1;
          }
        }
      }
      start = start + 1;
    } while (length != start);
  }
  if (newArr != (JavascriptArray *)0x0) {
    (*(newArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
      .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(newArr);
  }
  *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return newObj;
}

Assistant:

Var JavascriptArray::FilterObjectHelper(RecyclableObject* obj, T length, T start, JavascriptArray* newArr, RecyclableObject* newObj, T newStart,
        RecyclableObject* callBackFn, Var thisArg, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        Var element = nullptr;
        Var selected = nullptr;
        BigIndex i = BigIndex(newStart);

        for (T k = start; k < length; k++)
        {
            JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, k));
            if (hasItem)
            {
                JS_REENTRANT(jsReentLock,
                    element = JavascriptOperators::GetItem(obj, k, scriptContext);
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        selected = CALL_ENTRYPOINT(scriptContext->GetThreadContext(),
                                callBackFn->GetEntryPoint(), callBackFn, CallInfo(CallFlags_Value, 4),
                                thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                obj);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(selected, scriptContext))
                {
                    if (newArr)
                    {
                        newArr->GenericDirectSetItemAt(i, element);
                    }
                    else
                    {
                        JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(newObj, i, element), scriptContext, i));
                    }

                    ++i;
                }
            }
        }

#ifdef VALIDATE_ARRAY
        if (newArr)
        {
            newArr->ValidateArray();
        }
#endif

        return newObj;
    }